

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.c
# Opt level: O0

flatcc_builder_ref_t
flatcc_builder_create_struct(flatcc_builder_t *B,void *data,size_t size,uint16_t align)

{
  flatbuffers_uoffset_t fVar1;
  flatcc_builder_ref_t fVar2;
  undefined1 local_c0 [8];
  flatcc_iov_state_t iov;
  size_t pad;
  uint16_t align_local;
  size_t size_local;
  void *data_local;
  flatcc_builder_t *B_local;
  
  if (align != 0) {
    set_min_align(B,align);
    fVar1 = front_pad(B,(flatbuffers_uoffset_t)size,align);
    iov.iov[7].iov_len = (size_t)fVar1;
    local_c0 = (undefined1  [8])0x0;
    if (size != 0) {
      local_c0 = (undefined1  [8])size;
      iov._8_8_ = data;
      iov.iov[0].iov_base = (void *)size;
    }
    iov.len._1_3_ = 0;
    iov.len._0_1_ = size != 0;
    if ((void *)iov.iov[7].iov_len != (void *)0x0) {
      local_c0 = (undefined1  [8])(iov.iov[7].iov_len + (long)local_c0);
      iov.iov[(long)(int)(uint)iov.len + -1].iov_len = (size_t)"";
      iov.iov[(int)(uint)iov.len].iov_base = (void *)iov.iov[7].iov_len;
      iov.len._0_4_ = (uint)iov.len + 1;
    }
    fVar2 = emit_front(B,(flatcc_iov_state_t *)local_c0);
    return fVar2;
  }
  __assert_fail("align >= 1",
                "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/runtime/builder.c"
                ,0x31e,
                "flatcc_builder_ref_t flatcc_builder_create_struct(flatcc_builder_t *, const void *, size_t, uint16_t)"
               );
}

Assistant:

flatcc_builder_ref_t flatcc_builder_create_struct(flatcc_builder_t *B, const void *data, size_t size, uint16_t align)
{
    size_t pad;
    iov_state_t iov;

    check(align >= 1, "align cannot be 0");
    set_min_align(B, align);
    pad = front_pad(B, (uoffset_t)size, align);
    init_iov();
    push_iov(data, size);
    /*
     * Normally structs will already be a multiple of their alignment,
     * so this padding will not likely be emitted.
     */
    push_iov(_pad, pad);
    return emit_front(B, &iov);
}